

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void duckdb::AddDecimalArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
               (AggregateFunctionSet *fun,LogicalType *by_type)

{
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_1a1;
  LogicalType local_1a0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_188;
  LogicalType local_170 [24];
  LogicalType local_158 [24];
  AggregateFunction local_140;
  
  duckdb::LogicalType::LogicalType(local_170,DECIMAL);
  duckdb::LogicalType::LogicalType(local_158,by_type);
  __l._M_len = 2;
  __l._M_array = local_170;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_188,__l,&local_1a1);
  duckdb::LogicalType::LogicalType(local_1a0,DECIMAL);
  AggregateFunction::AggregateFunction
            (&local_140,(vector<duckdb::LogicalType,_true> *)&local_188,local_1a0,
             (aggregate_size_t)0x0,(aggregate_initialize_t)0x0,(aggregate_update_t)0x0,
             (aggregate_combine_t)0x0,(aggregate_finalize_t)0x0,(aggregate_simple_update_t)0x0,
             BindDecimalArgMinMax<duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>,
             (aggregate_destructor_t)0x0,(aggregate_statistics_t)0x0,(aggregate_window_t)0x0,
             (aggregate_serialize_t)0x0,(aggregate_deserialize_t)0x0);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            ((vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
             (fun + 0x20),&local_140);
  AggregateFunction::~AggregateFunction(&local_140);
  duckdb::LogicalType::~LogicalType(local_1a0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_188);
  lVar1 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_170 + lVar1);
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

void AddDecimalArgMinMaxFunctionBy(AggregateFunctionSet &fun, const LogicalType &by_type) {
	fun.AddFunction(AggregateFunction({LogicalTypeId::DECIMAL, by_type}, LogicalTypeId::DECIMAL, nullptr, nullptr,
	                                  nullptr, nullptr, nullptr, nullptr, BindDecimalArgMinMax<OP>));
}